

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JulianCalendar.cpp
# Opt level: O2

void __thiscall JulianCalendar::JulianCalendar(JulianCalendar *this,int date)

{
  JulianCalendar *pJVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  JulianCalendar local_50;
  JulianCalendar *local_38;
  
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016cd68;
  uVar4 = (date + -2) / 0x16e - 1;
  do {
    local_50.super_Calendar.year = uVar4 + 2;
    local_50.super_Calendar.month = 1;
    local_50.super_Calendar.day = 1;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016cd68;
    iVar2 = operator_cast_to_int(&local_50);
    uVar4 = uVar4 + 1;
  } while (iVar2 <= date);
  (this->super_Calendar).year = uVar4;
  uVar3 = 0;
  local_38 = this;
  do {
    uVar3 = uVar3 + 1;
    if (uVar3 < 0xc) {
      local_50.super_Calendar.day = 0x1e;
      if (((0xa50U >> (uVar3 & 0x1f) & 1) == 0) &&
         (local_50.super_Calendar.day = ((uVar4 & 3) == 0) + 0x1c, uVar3 != 2)) goto LAB_00151462;
    }
    else {
LAB_00151462:
      local_50.super_Calendar.day = 0x1f;
    }
    local_50.super_Calendar.month = uVar3;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016cd68;
    local_50.super_Calendar.year = uVar4;
    iVar2 = operator_cast_to_int(&local_50);
    pJVar1 = local_38;
    if (date <= iVar2) {
      (local_38->super_Calendar).month = uVar3;
      local_50.super_Calendar.day = 1;
      local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016cd68;
      local_50.super_Calendar.year = uVar4;
      iVar2 = operator_cast_to_int(&local_50);
      (pJVar1->super_Calendar).day = (date - iVar2) + 1;
      return;
    }
  } while( true );
}

Assistant:

JulianCalendar::JulianCalendar(int date) {
    year = (date + JulianEpoch) / year_max_len;
    while (date >= JulianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > JulianCalendar(month, LastMonthDay(month, year), year))
        month++;
    int JulDay = JulianCalendar(month, 1, year);
    day = date - JulDay + 1;
}